

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O1

ssize_t __thiscall xs::HelloMessage::write(HelloMessage *this,int __fd,void *__buf,size_t __n)

{
  pointer puVar1;
  pointer puVar2;
  uint *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RAX;
  uint uVar4;
  undefined4 in_register_00000034;
  MessageWriter writer;
  MessageWriter local_18;
  
  local_18.m_buf = in_RAX;
  MessageWriter::MessageWriter
            (&local_18,(this->super_Message).type,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_register_00000034,__fd));
  uVar4 = *(uint *)&(this->super_Message).field_0xc;
  puVar1 = ((local_18.m_buf)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = ((local_18.m_buf)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_18.m_buf,(size_type)(puVar1 + (4 - (long)puVar2)));
  *(uint *)(puVar1 + ((long)((local_18.m_buf)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start - (long)puVar2)) =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  puVar3 = (uint *)((local_18.m_buf)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  uVar4 = *(int *)&((local_18.m_buf)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar3;
  *puVar3 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000;
  return (ssize_t)puVar3;
}

Assistant:

void HelloMessage::write (vector<deUint8>& buf) const
{
	MessageWriter writer(type, buf);
	writer.put(version);
}